

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)

{
  QAnimationTimer *obj;
  qsizetype qVar1;
  int iVar2;
  long in_FS_OFFSET;
  QAbstractAnimation *animation_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  animation_local = animation;
  obj = instance(false);
  if (obj != (QAnimationTimer *)0x0) {
    unregisterRunningAnimation((QAnimationTimer *)obj,animation);
    if (*(char *)((long)&(animation->super_QObject).d_ptr.d[1].bindingStorage.d + 1) != '\x01')
    goto LAB_0036005e;
    qVar1 = QtPrivate::indexOf<QAbstractAnimation*,QAbstractAnimation*>
                      (&obj->animations,&animation_local,0);
    iVar2 = (int)qVar1;
    if (iVar2 == -1) {
      QtPrivate::sequential_erase_one<QList<QAbstractAnimation*>,QAbstractAnimation*>
                (&obj->animationsToStart,&animation_local);
    }
    else {
      QList<QAbstractAnimation_*>::removeAt(&obj->animations,(long)iVar2);
      if (iVar2 <= obj->currentAnimationIdx) {
        obj->currentAnimationIdx = obj->currentAnimationIdx + -1;
      }
      if (((obj->animations).d.size == 0) && (obj->stopTimerPending == false)) {
        obj->stopTimerPending = true;
        QMetaObject::invokeMethod<>((QObject *)obj,"stopTimer",QueuedConnection);
      }
    }
  }
  *(undefined1 *)((long)&(animation_local->super_QObject).d_ptr.d[1].bindingStorage.d + 1) = 0;
LAB_0036005e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationTimer::unregisterAnimation(QAbstractAnimation *animation)
{
    QAnimationTimer *inst = QAnimationTimer::instance(false);
    if (inst) {
        //at this point the unified timer should have been created
        //but it might also have been already destroyed in case the application is shutting down

        inst->unregisterRunningAnimation(animation);

        if (!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer)
            return;

        int idx = inst->animations.indexOf(animation);
        if (idx != -1) {
            inst->animations.removeAt(idx);
            // this is needed if we unregister an animation while its running
            if (idx <= inst->currentAnimationIdx)
                --inst->currentAnimationIdx;

            if (inst->animations.isEmpty() && !inst->stopTimerPending) {
                inst->stopTimerPending = true;
                QMetaObject::invokeMethod(inst, "stopTimer", Qt::QueuedConnection);
            }
        } else {
            inst->animationsToStart.removeOne(animation);
        }
    }
    QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = false;
}